

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::DoCleanTarget(Cleaner *this,Node *target)

{
  bool bVar1;
  string *path;
  reference ppNVar2;
  size_type sVar3;
  Node *local_38;
  Node *next;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  iterator n;
  Edge *e;
  Node *target_local;
  Cleaner *this_local;
  
  e = (Edge *)target;
  target_local = (Node *)this;
  n._M_current = (Node **)Node::in_edge(target);
  if ((Edge *)n._M_current != (Edge *)0x0) {
    bVar1 = Edge::is_phony((Edge *)n._M_current);
    if (!bVar1) {
      path = Node::path_abi_cxx11_((Node *)e);
      Remove(this,path);
      RemoveEdgeFiles(this,(Edge *)n._M_current);
    }
    local_28._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(n._M_current + 2));
    while( true ) {
      next = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end
                               ((vector<Node_*,_std::allocator<Node_*>_> *)(n._M_current + 2));
      bVar1 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                          *)&next);
      if (!bVar1) break;
      ppNVar2 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_28);
      local_38 = *ppNVar2;
      sVar3 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::count
                        (&this->cleaned_,&local_38);
      if (sVar3 == 0) {
        DoCleanTarget(this,local_38);
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_28);
    }
  }
  std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
            (&this->cleaned_,(value_type *)&e);
  return;
}

Assistant:

void Cleaner::DoCleanTarget(Node* target) {
  if (Edge* e = target->in_edge()) {
    // Do not try to remove phony targets
    if (!e->is_phony()) {
      Remove(target->path());
      RemoveEdgeFiles(e);
    }
    for (vector<Node*>::iterator n = e->inputs_.begin(); n != e->inputs_.end();
         ++n) {
      Node* next = *n;
      // call DoCleanTarget recursively if this node has not been visited
      if (cleaned_.count(next) == 0) {
        DoCleanTarget(next);
      }
    }
  }

  // mark this target to be cleaned already
  cleaned_.insert(target);
}